

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,BinaryOperator *b)

{
  uint64_t uVar1;
  bool bVar2;
  Expression *pEVar3;
  ulong uVar4;
  Constant *pCVar5;
  bool *this_00;
  CompileMessage local_c0;
  Type local_88;
  Type local_70;
  int local_54;
  int result;
  pool_ptr<soul::AST::Constant> rhsConst;
  pool_ptr<soul::AST::Constant> lhsConst;
  undefined1 local_30 [8];
  Type operandType;
  BinaryOperator *b_local;
  PostResolutionChecks *this_local;
  
  operandType.structure.object = (Structure *)b;
  ASTVisitor::visit(&this->super_ASTVisitor,b);
  pEVar3 = pool_ref::operator_cast_to_Expression_
                     ((pool_ref *)(((operandType.structure.object)->members).space + 1));
  throwErrorIfNotReadableValue(pEVar3);
  uVar4 = (**(code **)(*(long *)operandType.structure.object + 0x48))();
  if ((uVar4 & 1) == 0) {
    pEVar3 = pool_ref::operator_cast_to_Expression_
                       ((pool_ref *)((operandType.structure.object)->members).space);
    throwErrorIfNotReadableValue(pEVar3);
    AST::BinaryOperator::getOperandType
              ((Type *)local_30,(BinaryOperator *)operandType.structure.object);
    bVar2 = Type::isValid((Type *)local_30);
    if (!bVar2) {
      throwErrorForBinaryOperatorTypes((BinaryOperator *)operandType.structure.object);
    }
    bVar2 = BinaryOp::isComparisonOperator((Op)((operandType.structure.object)->members).space[2]);
    if (bVar2) {
      pEVar3 = pool_ref<soul::AST::Expression>::operator->
                         ((pool_ref<soul::AST::Expression> *)
                          ((operandType.structure.object)->members).space);
      (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&rhsConst);
      pEVar3 = pool_ref<soul::AST::Expression>::operator->
                         ((pool_ref<soul::AST::Expression> *)
                          (((operandType.structure.object)->members).space + 1));
      (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&stack0xffffffffffffffb0);
      local_54 = 0;
      bVar2 = pool_ptr<soul::AST::Constant>::operator!=(&rhsConst,(void *)0x0);
      if ((bVar2) &&
         (bVar2 = pool_ptr<soul::AST::Constant>::operator==
                            ((pool_ptr<soul::AST::Constant> *)&stack0xffffffffffffffb0,(void *)0x0),
         bVar2)) {
        uVar1 = ((operandType.structure.object)->members).space[2];
        pCVar5 = pool_ptr<soul::AST::Constant>::operator->(&rhsConst);
        pEVar3 = pool_ref<soul::AST::Expression>::operator->
                           ((pool_ref<soul::AST::Expression> *)
                            (((operandType.structure.object)->members).space + 1));
        (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_70);
        local_54 = BinaryOp::getResultOfComparisonWithBoundedType
                             ((Op)uVar1,&pCVar5->value,&local_70);
        Type::~Type(&local_70);
      }
      bVar2 = pool_ptr<soul::AST::Constant>::operator==(&rhsConst,(void *)0x0);
      if ((bVar2) &&
         (bVar2 = pool_ptr<soul::AST::Constant>::operator!=
                            ((pool_ptr<soul::AST::Constant> *)&stack0xffffffffffffffb0,(void *)0x0),
         bVar2)) {
        uVar1 = ((operandType.structure.object)->members).space[2];
        pEVar3 = pool_ref<soul::AST::Expression>::operator->
                           ((pool_ref<soul::AST::Expression> *)
                            ((operandType.structure.object)->members).space);
        (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_88);
        pCVar5 = pool_ptr<soul::AST::Constant>::operator->
                           ((pool_ptr<soul::AST::Constant> *)&stack0xffffffffffffffb0);
        local_54 = BinaryOp::getResultOfComparisonWithBoundedType
                             ((Op)uVar1,&local_88,&pCVar5->value);
        Type::~Type(&local_88);
      }
      if (local_54 != 0) {
        this_00 = &(operandType.structure.object)->activeUseFlag;
        if (local_54 < 1) {
          Errors::comparisonAlwaysFalse<>();
        }
        else {
          Errors::comparisonAlwaysTrue<>();
        }
        AST::Context::throwError((Context *)this_00,&local_c0,false);
      }
      pool_ptr<soul::AST::Constant>::~pool_ptr
                ((pool_ptr<soul::AST::Constant> *)&stack0xffffffffffffffb0);
      pool_ptr<soul::AST::Constant>::~pool_ptr(&rhsConst);
    }
    Type::~Type((Type *)local_30);
  }
  return;
}

Assistant:

void visit (AST::BinaryOperator& b) override
        {
            super::visit (b);

            throwErrorIfNotReadableValue (b.rhs);

            if (b.isOutputEndpoint())
                return;

            throwErrorIfNotReadableValue (b.lhs);

            auto operandType = b.getOperandType();

            if (! operandType.isValid())
                throwErrorForBinaryOperatorTypes (b);

            if (BinaryOp::isComparisonOperator (b.operation))
            {
                auto lhsConst = b.lhs->getAsConstant();
                auto rhsConst = b.rhs->getAsConstant();
                int result = 0;

                if (lhsConst != nullptr && rhsConst == nullptr)
                    result = BinaryOp::getResultOfComparisonWithBoundedType (b.operation, lhsConst->value, b.rhs->getResultType());

                if (lhsConst == nullptr && rhsConst != nullptr)
                    result = BinaryOp::getResultOfComparisonWithBoundedType (b.operation, b.lhs->getResultType(), rhsConst->value);

                if (result != 0)
                    b.context.throwError (result > 0 ? Errors::comparisonAlwaysTrue()
                                                     : Errors::comparisonAlwaysFalse());
            }
        }